

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O0

void block_readpipe(int pipefd,void *buffer,int sz)

{
  FILE *__stream;
  ssize_t sVar1;
  int *piVar2;
  char *pcVar3;
  int n;
  int sz_local;
  void *buffer_local;
  int pipefd_local;
  
  do {
    sVar1 = read(pipefd,buffer,(long)sz);
    if (-1 < (int)sVar1) {
      if ((int)sVar1 == sz) {
        return;
      }
      __assert_fail("n == sz",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/skynet-src/socket_server.c"
                    ,0x366,"void block_readpipe(int, void *, int)");
    }
    piVar2 = __errno_location();
    __stream = _stderr;
  } while (*piVar2 == 4);
  piVar2 = __errno_location();
  pcVar3 = strerror(*piVar2);
  fprintf(__stream,"socket-server : read pipe error %s.\n",pcVar3);
  return;
}

Assistant:

static void
block_readpipe(int pipefd, void *buffer, int sz) {
	for (;;) {
		int n = read(pipefd, buffer, sz);
		if (n<0) {
			if (errno == EINTR)
				continue;
			fprintf(stderr, "socket-server : read pipe error %s.\n",strerror(errno));
			return;
		}
		// must atomic read from a pipe
		assert(n == sz);
		return;
	}
}